

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyResyn.c
# Opt level: O2

Ivy_Man_t * Ivy_ManRwsat(Ivy_Man_t *pMan,int fVerbose)

{
  abctime aVar1;
  abctime aVar2;
  Ivy_Man_t *p;
  int iVar3;
  
  if (fVerbose != 0) {
    puts("Original:");
    Ivy_ManPrintStats(pMan);
  }
  aVar1 = Abc_Clock();
  Ivy_ManRewritePre(pMan,0,0,0);
  if (fVerbose != 0) {
    iVar3 = 10;
    putchar(10);
    Abc_Print(iVar3,"%s =","Rewrite");
    aVar2 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
    Ivy_ManPrintStats(pMan);
  }
  aVar1 = Abc_Clock();
  p = Ivy_ManBalance(pMan,0);
  Ivy_ManStop(pMan);
  if (fVerbose != 0) {
    iVar3 = 10;
    putchar(10);
    Abc_Print(iVar3,"%s =","Balance");
    aVar2 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
    Ivy_ManPrintStats(p);
  }
  return p;
}

Assistant:

Ivy_Man_t * Ivy_ManRwsat( Ivy_Man_t * pMan, int fVerbose )
{
    abctime clk;
    Ivy_Man_t * pTemp;

if ( fVerbose ) { printf( "Original:\n" ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, 0, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, 0 );
//    pMan = Ivy_ManDup( pTemp = pMan );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

/*
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, 0, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, 0 );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );
*/
    return pMan;
}